

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O0

int __thiscall
Inter_Symbol_Generator::G_LT_Matrix_Generator
          (Inter_Symbol_Generator *this,Array_Data_Symbol *p,uint32_t M,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *_ESIs)

{
  uint32_t K;
  uint uVar1;
  uint8_t **ppuVar2;
  reference pvVar3;
  uint *puVar4;
  Triple TVar5;
  uint local_5c;
  uint local_58;
  uint local_54;
  undefined4 uStack_50;
  int j;
  uint32_t local_48;
  undefined8 local_40;
  uint32_t local_38;
  uint local_34;
  uint32_t local_30;
  int i;
  uint32_t N;
  uint32_t overhead;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *_ESIs_local;
  Array_Data_Symbol *pAStack_18;
  uint32_t M_local;
  Array_Data_Symbol *p_local;
  Inter_Symbol_Generator *this_local;
  
  _N = _ESIs;
  _ESIs_local._4_4_ = M;
  pAStack_18 = p;
  p_local = (Array_Data_Symbol *)this;
  if ((this->G_LT != (uint8_t **)0x0) && (this->G_LT != (uint8_t **)0x0)) {
    operator_delete(this->G_LT,8);
  }
  i = _ESIs_local._4_4_ - pAStack_18->L;
  local_30 = pAStack_18->K + i;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->ESIs,_ESIs);
  ppuVar2 = new_matrix(this,local_30,pAStack_18->L);
  this->G_LT = ppuVar2;
  for (local_34 = 0; local_34 < local_30; local_34 = local_34 + 1) {
    K = pAStack_18->K;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->ESIs,(long)(int)local_34);
    TVar5 = Triple_Generator::triple_generator(&this->triple,K,*pvVar3,pAStack_18->LP);
    _uStack_50 = TVar5._0_8_;
    local_40 = _uStack_50;
    local_48 = TVar5.b;
    local_38 = local_48;
    (this->triple)._triple.d = uStack_50;
    (this->triple)._triple.a = j;
    (this->triple)._triple.b = local_48;
    while (pAStack_18->L <= (this->triple)._triple.b) {
      (this->triple)._triple.b =
           ((this->triple)._triple.b + (this->triple)._triple.a) % pAStack_18->LP;
    }
    this->G_LT[(int)local_34][(this->triple)._triple.b] = '\x01';
    local_54 = 1;
    _uStack_50 = TVar5;
    while( true ) {
      uVar1 = local_54;
      local_58 = (this->triple)._triple.d - 1;
      local_5c = pAStack_18->L - 1;
      puVar4 = std::min<unsigned_int>(&local_58,&local_5c);
      if (*puVar4 < uVar1) break;
      (this->triple)._triple.b =
           ((this->triple)._triple.b + (this->triple)._triple.a) % pAStack_18->LP;
      while (pAStack_18->L <= (this->triple)._triple.b) {
        (this->triple)._triple.b =
             ((this->triple)._triple.b + (this->triple)._triple.a) % pAStack_18->LP;
      }
      this->G_LT[(int)local_34][(this->triple)._triple.b] = '\x01';
      local_54 = local_54 + 1;
    }
  }
  return 0;
}

Assistant:

int Inter_Symbol_Generator::G_LT_Matrix_Generator(class Array_Data_Symbol *p, uint32_t M, std::vector<uint32_t> _ESIs)
{
	if (G_LT != NULL)
	{
		delete G_LT;
	}
	uint32_t overhead = M - p->L;
	uint32_t N = p->K + overhead;

	ESIs = _ESIs;

//	std::cout << "N: " << N << std::endl;


	G_LT = new_matrix(N, p->L);


	for (int i = 0; i < N; i++)
	{
		triple._triple = triple.triple_generator(p->K, ESIs[i], p->LP);
	//	std::cout << "d : " << triple._triple.d << " a: " << triple._triple.a << " b: " << triple._triple.b << std::endl;
		while(triple._triple.b >= p->L)
		{
			triple._triple.b = (triple._triple.b + triple._triple.a) % p->LP;
		}

		G_LT[i][triple._triple.b] = 1;


		for (int j = 1; j <= std::min(triple._triple.d -1, p->L - 1); j++)
		{
			triple._triple.b = (triple._triple.b + triple._triple.a) % p->LP;
			while(triple._triple.b >= p->L)
			{
				triple._triple.b = (triple._triple.b + triple._triple.a) % p->LP;
			}
			//std::cout << "b: " << triple._triple.b << std::endl;
			G_LT[i][triple._triple.b] = 1;
		}
	}

//	matrix_print(G_LT, N, symbols_p->L);


	return 0;


}